

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void deqp::gls::ShaderExecUtil::BufferIoExecutor::declareBufferBlocks(ostream *src,ShaderSpec *spec)

{
  ostream *poVar1;
  pointer pSVar2;
  StructType inputStruct;
  StructType local_70;
  DeclareStructTypePtr local_38;
  
  if ((spec->inputs).
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (spec->inputs).
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70.m_typeName._M_dataplus._M_p = (pointer)&local_70.m_typeName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Inputs","");
    local_70.m_members.super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.m_members.super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.m_members.super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar2 = (spec->inputs).
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar2 != (spec->inputs).
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        glu::StructType::addMember(&local_70,(pSVar2->name)._M_dataplus._M_p,&pSVar2->varType);
        pSVar2 = pSVar2 + 1;
      } while (pSVar2 != (spec->inputs).
                         super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_38.indentLevel = 0;
    local_38.structPtr = &local_70;
    poVar1 = glu::decl::operator<<(src,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
    glu::StructType::~StructType(&local_70);
  }
  local_70.m_typeName._M_dataplus._M_p = (pointer)&local_70.m_typeName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Outputs","");
  local_70.m_members.super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.m_members.super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.m_members.super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = (spec->outputs).
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar2 != (spec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      glu::StructType::addMember(&local_70,(pSVar2->name)._M_dataplus._M_p,&pSVar2->varType);
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != (spec->outputs).
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_38.indentLevel = 0;
  local_38.structPtr = &local_70;
  poVar1 = glu::decl::operator<<(src,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  glu::StructType::~StructType(&local_70);
  std::__ostream_insert<char,std::char_traits<char>>(src,"\n",1);
  if ((spec->inputs).
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (spec->inputs).
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(src,"layout(binding = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(src,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", std430) buffer InBuffer\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tInputs inputs[];\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"};\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(src,"layout(binding = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(src,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", std430) buffer OutBuffer\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOutputs outputs[];\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void BufferIoExecutor::declareBufferBlocks (std::ostream& src, const ShaderSpec& spec)
{
	// Input struct
	if (!spec.inputs.empty())
	{
		glu::StructType inputStruct("Inputs");
		for (vector<Symbol>::const_iterator symIter = spec.inputs.begin(); symIter != spec.inputs.end(); ++symIter)
			inputStruct.addMember(symIter->name.c_str(), symIter->varType);
		src << glu::declare(&inputStruct) << ";\n";
	}

	// Output struct
	{
		glu::StructType outputStruct("Outputs");
		for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
			outputStruct.addMember(symIter->name.c_str(), symIter->varType);
		src << glu::declare(&outputStruct) << ";\n";
	}

	src << "\n";

	if (!spec.inputs.empty())
	{
		src	<< "layout(binding = " << int(INPUT_BUFFER_BINDING) << ", std430) buffer InBuffer\n"
			<< "{\n"
			<< "	Inputs inputs[];\n"
			<< "};\n";
	}

	src	<< "layout(binding = " << int(OUTPUT_BUFFER_BINDING) << ", std430) buffer OutBuffer\n"
		<< "{\n"
		<< "	Outputs outputs[];\n"
		<< "};\n"
		<< "\n";
}